

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_val_t FromWabtValue(Store *store,TypedValue *tv)

{
  FILE *pFVar1;
  Enum EVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  TypedValue *in_RDX;
  wasm_val_t wVar5;
  RefPtr<wabt::interp::Foreign> local_a0;
  size_t local_88;
  RefPtr<wabt::interp::Func> local_80;
  Enum local_64;
  size_t local_60;
  Type local_54;
  Ref RStack_50;
  Type type;
  Ref ref;
  TypedValue *tv_local;
  Store *store_local;
  wasm_val_t out_value;
  
  pFVar1 = _stderr;
  wabt::interp::TypedValueToString_abi_cxx11_((string *)&ref,(interp *)tv,in_RDX);
  uVar3 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"CAPI: [%s] %s\n","FromWabtValue",uVar3);
  std::__cxx11::string::~string((string *)&ref);
  EVar2 = wabt::Type::operator_cast_to_Enum(&tv->type);
  pFVar1 = _stderr;
  switch(EVar2) {
  case Nullref:
  case Anyref:
  case Funcref:
  case Hostref:
    local_60 = (size_t)wabt::interp::Value::Get<wabt::interp::Ref>((Value *)&(tv->value).v128_);
    RStack_50 = (Ref)local_60;
    local_64 = (Enum)wabt::interp::Store::GetValueType(store,(Ref)local_60);
    local_54.enum_ = local_64;
    store_local._0_1_ = FromWabtValueType((ValueType)local_64);
    EVar2 = wabt::Type::operator_cast_to_Enum(&local_54);
    uVar4 = (ulong)(uint)(EVar2 + 0x12);
    if (EVar2 + 0x12 == 0) {
      out_value.kind = '\0';
      out_value._1_7_ = 0;
    }
    else if (EVar2 == Funcref) {
      out_value._0_8_ = operator_new(0x18);
      local_88 = RStack_50.index;
      wabt::interp::Store::UnsafeGet<wabt::interp::Func>(&local_80,store,RStack_50);
      wasm_func_t::wasm_func_t((wasm_func_t *)out_value._0_8_,&local_80);
      wabt::interp::RefPtr<wabt::interp::Func>::~RefPtr(&local_80);
      uVar4 = extraout_RAX_01;
    }
    else {
      if (EVar2 != Hostref) {
        abort();
      }
      out_value._0_8_ = operator_new(0x18);
      wabt::interp::Store::UnsafeGet<wabt::interp::Foreign>(&local_a0,store,RStack_50);
      wasm_foreign_t::wasm_foreign_t((wasm_foreign_t *)out_value._0_8_,&local_a0);
      wabt::interp::RefPtr<wabt::interp::Foreign>::~RefPtr(&local_a0);
      uVar4 = extraout_RAX_02;
    }
    break;
  default:
    EVar2 = wabt::Type::operator_cast_to_Enum(&tv->type);
    fprintf(pFVar1,"CAPI: [%s] unexpected wabt type: %d\n","FromWabtValue",(ulong)(uint)EVar2);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x1ce,"wasm_val_t FromWabtValue(Store &, const TypedValue &)");
  case F64:
    store_local._0_1_ = '\x03';
    out_value._0_8_ = wabt::interp::Value::Get<double>((Value *)&(tv->value).v128_);
    uVar4 = extraout_RAX_00;
    break;
  case F32:
    store_local._0_1_ = '\x02';
    out_value._0_4_ = wabt::interp::Value::Get<float>((Value *)&(tv->value).v128_);
    uVar4 = extraout_RAX;
    break;
  case I64:
    store_local._0_1_ = '\x01';
    uVar4 = wabt::interp::Value::Get<long>((Value *)&(tv->value).v128_);
    out_value._0_8_ = uVar4;
    break;
  case I32:
    store_local._0_1_ = '\0';
    out_value._0_4_ = wabt::interp::Value::Get<int>((Value *)&(tv->value).v128_);
    uVar4 = CONCAT44(extraout_var,out_value._0_4_);
  }
  wVar5._1_7_ = (undefined7)(uVar4 >> 8);
  wVar5.kind = (wasm_valkind_t)store_local;
  wVar5.of = (anon_union_8_5_30786955_for_of)out_value._0_8_;
  return wVar5;
}

Assistant:

static wasm_val_t FromWabtValue(Store& store, const TypedValue& tv) {
  TRACE("%s", TypedValueToString(tv).c_str());
  wasm_val_t out_value;
  switch (tv.type) {
    case Type::I32:
      out_value.kind = WASM_I32;
      out_value.of.i32 = tv.value.Get<s32>();
      break;
    case Type::I64:
      out_value.kind = WASM_I64;
      out_value.of.i64 = tv.value.Get<s64>();
      break;
    case Type::F32:
      out_value.kind = WASM_F32;
      out_value.of.f32 = tv.value.Get<f32>();
      break;
    case Type::F64:
      out_value.kind = WASM_F64;
      out_value.of.f64 = tv.value.Get<f64>();
      break;
    case Type::Anyref:
    case Type::Funcref:
    case Type::Hostref:
    case Type::Nullref: {
      Ref ref = tv.value.Get<Ref>();
      // Get the actual type for this reference; tv.type uses the function
      // signature, which may be to general (e.g. anyref).
      Type type = store.GetValueType(ref);
      out_value.kind = FromWabtValueType(type);
      switch (type) {
        case Type::Funcref:
          out_value.of.ref = new wasm_func_t(store.UnsafeGet<Func>(ref));
          break;

        case Type::Hostref:
          out_value.of.ref = new wasm_foreign_t(store.UnsafeGet<Foreign>(ref));
          break;

        case Type::Nullref:
          out_value.of.ref = nullptr;
          break;

        default: WABT_UNREACHABLE;
      }
      break;
    }
    default:
      TRACE("unexpected wabt type: %d", static_cast<int>(tv.type));
      assert(false);
  }
  return out_value;
}